

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O1

aiNode * ImportNode(aiScene *pScene,Asset *r,
                   vector<unsigned_int,_std::allocator<unsigned_int>_> *meshOffsets,
                   Ref<glTF2::Node> *ptr)

{
  float fVar1;
  pointer pRVar2;
  pointer pRVar3;
  pointer pRVar4;
  pointer pRVar5;
  pointer puVar6;
  aiMesh *paVar7;
  Skin *pSVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong *puVar14;
  long *plVar15;
  Light *pLVar16;
  bool bVar17;
  size_type sVar18;
  aiScene *pScene_00;
  pointer pvVar19;
  int iVar20;
  aiNode *this;
  ulong uVar21;
  aiNode **ppaVar22;
  aiNode *paVar23;
  uint *puVar24;
  aiBone **ppaVar25;
  void *pvVar26;
  aiBone *paVar27;
  aiVertexWeight *paVar28;
  aiMetadata *paVar29;
  aiString *paVar30;
  aiMetadataEntry *__s;
  float *pfVar31;
  long lVar32;
  char *pcVar33;
  ulong uVar34;
  uint uVar35;
  long lVar36;
  ulong uVar37;
  void *pvVar38;
  ulong uVar39;
  bool bVar40;
  char *pcVar41;
  char *pcVar42;
  int j;
  Node *node;
  void *pvVar43;
  void *pvVar44;
  float weight;
  char postfix [10];
  mat4 *pbindMatrices;
  vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
  weighting;
  long local_d8;
  string local_d0;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined2 local_a8;
  void *local_a0;
  aiScene *local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_90;
  Node *local_88;
  float (*local_80) [16];
  void *local_78;
  long local_70;
  long local_68;
  aiMesh *local_60;
  vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
  local_58;
  ulong local_40;
  ulong local_38;
  
  node = (ptr->vector->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl.
         super__Vector_impl_data._M_start[ptr->index];
  local_98 = pScene;
  local_90 = meshOffsets;
  this = (aiNode *)operator_new(0x478);
  uVar21 = (ulong)((node->super_Object).name._M_string_length != 0);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  lVar36 = *(long *)((node->matrix).value + uVar21 * 8 + -0x1c);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,lVar36,
             *(long *)((node->matrix).value + uVar21 * 8 + -0x1a) + lVar36);
  aiNode::aiNode(this,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  pScene_00 = local_98;
  pRVar2 = (node->children).
           super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar3 = (node->children).
           super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar2 != pRVar3) {
    uVar21 = (long)pRVar3 - (long)pRVar2;
    uVar35 = (uint)(uVar21 >> 4);
    this->mNumChildren = uVar35;
    ppaVar22 = (aiNode **)operator_new__(uVar21 >> 1 & 0x7fffffff8);
    this->mChildren = ppaVar22;
    if (uVar35 != 0) {
      lVar36 = 0;
      uVar21 = 0;
      do {
        paVar23 = ImportNode(pScene_00,r,local_90,
                             (Ref<glTF2::Node> *)
                             ((long)&((node->children).
                                      super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->vector + lVar36));
        paVar23->mParent = this;
        this->mChildren[uVar21] = paVar23;
        uVar21 = uVar21 + 1;
        lVar36 = lVar36 + 0x10;
      } while (uVar21 < this->mNumChildren);
    }
  }
  GetNodeTransform(&this->mTransformation,node);
  pRVar4 = (node->meshes).
           super__Vector_base<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar5 = (node->meshes).
           super__Vector_base<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar4 != pRVar5) {
    if ((long)pRVar5 - (long)pRVar4 != 0x10) {
      __assert_fail("node.meshes.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/glTF2/glTF2Importer.cpp"
                    ,0x375,
                    "aiNode *ImportNode(aiScene *, glTF2::Asset &, std::vector<unsigned int> &, glTF2::Ref<glTF2::Node> &)"
                   );
    }
    local_70 = (long)(int)pRVar4->index;
    puVar6 = (local_90->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar35 = puVar6[local_70 + 1] - puVar6[local_70];
    this->mNumMeshes = uVar35;
    uVar21 = 0xffffffffffffffff;
    if (-1 < (int)uVar35) {
      uVar21 = (long)(int)uVar35 * 4;
    }
    puVar24 = (uint *)operator_new__(uVar21);
    this->mMeshes = puVar24;
    if (((node->skin).vector != (vector<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_> *)0x0) &&
       (0 < (int)uVar35)) {
      local_40 = (ulong)uVar35;
      uVar21 = 0;
      local_88 = node;
      do {
        paVar7 = local_98->mMeshes
                 [(local_90->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start[local_70] + (int)uVar21];
        pSVar8 = (((node->skin).vector)->
                 super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[(node->skin).index];
        uVar39 = (long)*(pointer *)
                        ((long)&(pSVar8->jointNames).
                                super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                        + 8) -
                 *(long *)&(pSVar8->jointNames).
                           super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                           ._M_impl;
        paVar7->mNumBones = (uint)(uVar39 >> 4);
        ppaVar25 = (aiBone **)operator_new__(uVar39 >> 1 & 0x7fffffff8);
        paVar7->mBones = ppaVar25;
        local_60 = paVar7;
        std::
        vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
        ::vector(&local_58,(ulong)paVar7->mNumBones,(allocator_type *)&local_d0);
        pRVar4 = (node->meshes).
                 super__Vector_base<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar36 = *(long *)(*(long *)(*(long *)&(pRVar4->vector->
                                               super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>
                                               )._M_impl + (ulong)pRVar4->index * 8) + 0x50);
        lVar32 = uVar21 * 0x100;
        puVar9 = *(undefined8 **)(lVar36 + 0xb0 + lVar32);
        local_38 = uVar21;
        if (puVar9 != *(undefined8 **)(lVar36 + 0xb8 + lVar32)) {
          lVar36 = lVar36 + lVar32;
          puVar10 = *(undefined8 **)(lVar36 + 0x80);
          if (puVar10 != *(undefined8 **)(lVar36 + 0x88)) {
            lVar32 = *(long *)(*(long *)*puVar9 + (ulong)*(uint *)(puVar9 + 1) * 8);
            local_68 = *(long *)(lVar32 + 0x70);
            if (local_68 ==
                *(long *)(*(long *)(*(long *)*puVar10 + (ulong)*(uint *)(puVar10 + 1) * 8) + 0x70))
            {
              if (*(long **)(lVar32 + 0x50) == (long *)0x0) {
LAB_00665e10:
                pvVar44 = (void *)0x0;
              }
              else {
                lVar11 = *(long *)(**(long **)(lVar32 + 0x50) + (ulong)*(uint *)(lVar32 + 0x58) * 8)
                ;
                if (*(long **)(lVar11 + 0x50) == (long *)0x0) goto LAB_00665e10;
                lVar12 = *(long *)(**(long **)(lVar11 + 0x50) + (ulong)*(uint *)(lVar11 + 0x58) * 8)
                ;
                lVar13 = *(long *)(lVar12 + 0x70);
                if (lVar13 == 0) goto LAB_00665e10;
                uVar21 = *(long *)(lVar11 + 0x60) + *(long *)(lVar32 + 0x60);
                puVar14 = *(ulong **)(lVar12 + 0x68);
                if (puVar14 == (ulong *)0x0) {
LAB_00666829:
                  pvVar44 = (void *)(lVar13 + uVar21);
                }
                else {
                  uVar39 = *puVar14;
                  bVar40 = true;
                  pvVar44 = (void *)(uVar21 - uVar39);
                  if ((uVar39 <= uVar21) && (uVar21 < uVar39 + puVar14[3])) {
                    pvVar44 = (void *)((long)pvVar44 + puVar14[2]);
                    bVar40 = false;
                  }
                  if (bVar40) goto LAB_00666829;
                }
              }
              if (pvVar44 == (void *)0x0) {
                local_a0 = (void *)0x0;
              }
              else {
                iVar20 = *(int *)(&DAT_009dab68 + (ulong)*(uint *)(lVar32 + 0x78) * 0x10);
                uVar35 = glTF2::ComponentTypeSize(*(ComponentType *)(lVar32 + 0x68));
                uVar35 = uVar35 * iVar20;
                uVar39 = (ulong)uVar35;
                plVar15 = *(long **)(lVar32 + 0x50);
                uVar21 = uVar39;
                if ((plVar15 != (long *)0x0) &&
                   (uVar21 = (ulong)*(uint *)(*(long *)(*plVar15 +
                                                       (ulong)*(uint *)(lVar32 + 0x58) * 8) + 0x70),
                   uVar21 == 0)) {
                  uVar21 = uVar39;
                }
                if (0x10 < uVar35) {
                  pcVar33 = "bool glTF2::Accessor::ExtractData(T *&) [T = Weights]";
                  goto LAB_00666b5f;
                }
                uVar37 = *(ulong *)(lVar32 + 0x70);
                uVar34 = *(ulong *)(*(long *)(*plVar15 + (ulong)*(uint *)(lVar32 + 0x58) * 8) + 0x68
                                   );
                if (uVar34 <= uVar21 * uVar37 && uVar21 * uVar37 - uVar34 != 0) {
                  pcVar33 = "bool glTF2::Accessor::ExtractData(T *&) [T = Weights]";
                  goto LAB_00666b7e;
                }
                pvVar26 = operator_new__(-(ulong)(uVar37 >> 0x3c != 0) | uVar37 << 4);
                local_a0 = pvVar26;
                if ((uVar35 == 0x10) && ((int)uVar21 == 0x10)) {
                  memcpy(pvVar26,pvVar44,uVar37 * uVar39);
                }
                else if (*(long *)(lVar32 + 0x70) != 0) {
                  uVar37 = 0;
                  do {
                    memcpy(pvVar26,pvVar44,uVar39);
                    uVar37 = uVar37 + 1;
                    pvVar44 = (void *)((long)pvVar44 + uVar21);
                    pvVar26 = (void *)((long)pvVar26 + 0x10);
                  } while (uVar37 < *(ulong *)(lVar32 + 0x70));
                }
              }
              lVar32 = *(long *)(*(long *)**(undefined8 **)(lVar36 + 0x80) +
                                (ulong)*(uint *)(*(undefined8 **)(lVar36 + 0x80) + 1) * 8);
              iVar20 = *(int *)(&DAT_009dab68 + (ulong)*(uint *)(lVar32 + 0x78) * 0x10);
              uVar35 = glTF2::ComponentTypeSize(*(ComponentType *)(lVar32 + 0x68));
              lVar36 = *(long *)(*(long *)**(undefined8 **)(lVar36 + 0x80) +
                                (ulong)*(uint *)(*(undefined8 **)(lVar36 + 0x80) + 1) * 8);
              plVar15 = *(long **)(lVar36 + 0x50);
              if (uVar35 * iVar20 == 4) {
                if (plVar15 == (long *)0x0) {
LAB_0066602f:
                  pvVar26 = (void *)0x0;
                }
                else {
                  lVar32 = *(long *)(*plVar15 + (ulong)*(uint *)(lVar36 + 0x58) * 8);
                  if (*(long **)(lVar32 + 0x50) == (long *)0x0) goto LAB_0066602f;
                  lVar11 = *(long *)(**(long **)(lVar32 + 0x50) +
                                    (ulong)*(uint *)(lVar32 + 0x58) * 8);
                  lVar12 = *(long *)(lVar11 + 0x70);
                  if (lVar12 == 0) goto LAB_0066602f;
                  uVar21 = *(long *)(lVar32 + 0x60) + *(long *)(lVar36 + 0x60);
                  puVar14 = *(ulong **)(lVar11 + 0x68);
                  if (puVar14 == (ulong *)0x0) {
LAB_0066684b:
                    pvVar26 = (void *)(lVar12 + uVar21);
                  }
                  else {
                    uVar39 = *puVar14;
                    bVar40 = true;
                    pvVar26 = (void *)(uVar21 - uVar39);
                    if ((uVar39 <= uVar21) && (uVar21 < uVar39 + puVar14[3])) {
                      pvVar26 = (void *)((long)pvVar26 + puVar14[2]);
                      bVar40 = false;
                    }
                    if (bVar40) goto LAB_0066684b;
                  }
                }
                if (pvVar26 == (void *)0x0) {
                  pvVar44 = (void *)0x0;
                  pvVar26 = (void *)0x0;
                }
                else {
                  iVar20 = *(int *)(&DAT_009dab68 + (ulong)*(uint *)(lVar36 + 0x78) * 0x10);
                  uVar35 = glTF2::ComponentTypeSize(*(ComponentType *)(lVar36 + 0x68));
                  uVar35 = uVar35 * iVar20;
                  uVar39 = (ulong)uVar35;
                  plVar15 = *(long **)(lVar36 + 0x50);
                  uVar21 = uVar39;
                  if ((plVar15 != (long *)0x0) &&
                     (uVar21 = (ulong)*(uint *)(*(long *)(*plVar15 +
                                                         (ulong)*(uint *)(lVar36 + 0x58) * 8) + 0x70
                                               ), uVar21 == 0)) {
                    uVar21 = uVar39;
                  }
                  if (4 < uVar35) {
                    pcVar33 = "bool glTF2::Accessor::ExtractData(T *&) [T = Indices8]";
LAB_00666b5f:
                    __assert_fail("elemSize <= targetElemSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/glTF2/glTF2Asset.inl"
                                  ,0x28a,pcVar33);
                  }
                  uVar37 = *(ulong *)(lVar36 + 0x70);
                  uVar34 = *(ulong *)(*(long *)(*plVar15 + (ulong)*(uint *)(lVar36 + 0x58) * 8) +
                                     0x68);
                  if (uVar34 <= uVar21 * uVar37 && uVar21 * uVar37 - uVar34 != 0) {
                    pcVar33 = "bool glTF2::Accessor::ExtractData(T *&) [T = Indices8]";
LAB_00666b7e:
                    __assert_fail("count*stride <= bufferView->byteLength",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/glTF2/glTF2Asset.inl"
                                  ,0x28c,pcVar33);
                  }
                  pvVar44 = operator_new__(-(ulong)(uVar37 >> 0x3e != 0) | uVar37 * 4);
                  if ((uVar35 == 4) && ((int)uVar21 == 4)) {
                    memcpy(pvVar44,pvVar26,uVar37 * uVar39);
                  }
                  else if (*(long *)(lVar36 + 0x70) != 0) {
                    uVar37 = 0;
                    do {
                      memcpy((void *)((long)pvVar44 + uVar37 * 4),pvVar26,uVar39);
                      uVar37 = uVar37 + 1;
                      pvVar26 = (void *)((long)pvVar26 + uVar21);
                    } while (uVar37 < *(ulong *)(lVar36 + 0x70));
                  }
LAB_006661de:
                  pvVar26 = (void *)0x0;
                }
              }
              else {
                if (plVar15 == (long *)0x0) {
LAB_006660f3:
                  pvVar44 = (void *)0x0;
                }
                else {
                  lVar32 = *(long *)(*plVar15 + (ulong)*(uint *)(lVar36 + 0x58) * 8);
                  if (*(long **)(lVar32 + 0x50) == (long *)0x0) goto LAB_006660f3;
                  lVar11 = *(long *)(**(long **)(lVar32 + 0x50) +
                                    (ulong)*(uint *)(lVar32 + 0x58) * 8);
                  lVar12 = *(long *)(lVar11 + 0x70);
                  if (lVar12 == 0) goto LAB_006660f3;
                  uVar21 = *(long *)(lVar32 + 0x60) + *(long *)(lVar36 + 0x60);
                  puVar14 = *(ulong **)(lVar11 + 0x68);
                  if (puVar14 == (ulong *)0x0) {
LAB_0066686d:
                    pvVar44 = (void *)(lVar12 + uVar21);
                  }
                  else {
                    uVar39 = *puVar14;
                    bVar40 = true;
                    pvVar44 = (void *)(uVar21 - uVar39);
                    if ((uVar39 <= uVar21) && (uVar21 < uVar39 + puVar14[3])) {
                      pvVar44 = (void *)((long)pvVar44 + puVar14[2]);
                      bVar40 = false;
                    }
                    if (bVar40) goto LAB_0066686d;
                  }
                }
                if (pvVar44 == (void *)0x0) {
                  pvVar44 = (void *)0x0;
                  goto LAB_006661de;
                }
                iVar20 = *(int *)(&DAT_009dab68 + (ulong)*(uint *)(lVar36 + 0x78) * 0x10);
                uVar35 = glTF2::ComponentTypeSize(*(ComponentType *)(lVar36 + 0x68));
                uVar35 = uVar35 * iVar20;
                uVar39 = (ulong)uVar35;
                plVar15 = *(long **)(lVar36 + 0x50);
                uVar21 = uVar39;
                if ((plVar15 != (long *)0x0) &&
                   (uVar21 = (ulong)*(uint *)(*(long *)(*plVar15 +
                                                       (ulong)*(uint *)(lVar36 + 0x58) * 8) + 0x70),
                   uVar21 == 0)) {
                  uVar21 = uVar39;
                }
                if (8 < uVar35) {
                  pcVar33 = "bool glTF2::Accessor::ExtractData(T *&) [T = Indices16]";
                  goto LAB_00666b5f;
                }
                uVar37 = *(ulong *)(lVar36 + 0x70);
                uVar34 = *(ulong *)(*(long *)(*plVar15 + (ulong)*(uint *)(lVar36 + 0x58) * 8) + 0x68
                                   );
                if (uVar34 <= uVar21 * uVar37 && uVar21 * uVar37 - uVar34 != 0) {
                  pcVar33 = "bool glTF2::Accessor::ExtractData(T *&) [T = Indices16]";
                  goto LAB_00666b7e;
                }
                pvVar26 = operator_new__(-(ulong)(uVar37 >> 0x3d != 0) | uVar37 * 8);
                if ((uVar35 == 8) && ((int)uVar21 == 8)) {
                  memcpy(pvVar26,pvVar44,uVar37 * uVar39);
                }
                else if (*(long *)(lVar36 + 0x70) != 0) {
                  uVar37 = 0;
                  do {
                    memcpy((void *)(uVar37 * 8 + (long)pvVar26),pvVar44,uVar39);
                    uVar37 = uVar37 + 1;
                    pvVar44 = (void *)((long)pvVar44 + uVar21);
                  } while (uVar37 < *(ulong *)(lVar36 + 0x70));
                }
                pvVar44 = (void *)0x0;
              }
              local_78 = pvVar26;
              if (pvVar44 == (void *)0x0 && pvVar26 == (void *)0x0) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/glTF2/glTF2Importer.cpp"
                              ,0x347,
                              "void BuildVertexWeightMapping(Mesh::Primitive &, std::vector<std::vector<aiVertexWeight>> &)"
                             );
              }
              if (local_68 != 0) {
                local_d8 = 0;
                pvVar38 = local_a0;
                pvVar43 = pvVar44;
                do {
                  lVar36 = 0;
                  do {
                    if (pvVar44 == (void *)0x0) {
                      uVar21 = (ulong)*(ushort *)((long)pvVar26 + lVar36 * 2);
                    }
                    else {
                      uVar21 = (ulong)*(byte *)((long)pvVar43 + lVar36);
                    }
                    fVar1 = *(float *)((long)pvVar38 + lVar36 * 4);
                    local_d0._M_dataplus._M_p._0_4_ = fVar1;
                    if ((0.0 < fVar1) &&
                       (uVar21 < (ulong)(((long)local_58.
                                                super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_58.
                                                super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                        -0x5555555555555555))) {
                      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::reserve
                                (local_58.
                                 super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar21,8);
                      _local_b0 = CONCAT44(uStack_ac,(int)local_d8);
                      std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>::
                      emplace_back<unsigned_int,float_const&>
                                ((vector<aiVertexWeight,std::allocator<aiVertexWeight>> *)
                                 ((long)&((local_58.
                                           super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                         )._M_impl.super__Vector_impl_data._M_start +
                                 (ulong)(uint)((int)uVar21 * 0x18)),&local_b0,(float *)&local_d0);
                    }
                    lVar36 = lVar36 + 1;
                  } while (lVar36 != 4);
                  local_d8 = local_d8 + 1;
                  pvVar26 = (void *)((long)pvVar26 + 8);
                  pvVar38 = (void *)((long)pvVar38 + 0x10);
                  pvVar43 = (void *)((long)pvVar43 + 4);
                } while (local_d8 != local_68);
              }
              if (local_a0 != (void *)0x0) {
                operator_delete__(local_a0);
              }
              node = local_88;
              if (pvVar44 != (void *)0x0) {
                operator_delete__(pvVar44);
              }
              if (local_78 != (void *)0x0) {
                operator_delete__(local_78);
              }
            }
          }
        }
        local_80 = (float (*) [16])0x0;
        pSVar8 = (((node->skin).vector)->
                 super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[(node->skin).index];
        glTF2::Accessor::ExtractData<float[16]>
                  (*(Accessor **)
                    (*(long *)&((pSVar8->inverseBindMatrices).vector)->
                               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                    + (ulong)(pSVar8->inverseBindMatrices).index * 8),&local_80);
        if (local_60->mNumBones != 0) {
          uVar21 = 0;
          do {
            paVar27 = (aiBone *)operator_new(0x450);
            (paVar27->mName).length = 0;
            pcVar33 = (paVar27->mName).data;
            (paVar27->mName).data[0] = '\0';
            memset((paVar27->mName).data + 1,0x1b,0x3ff);
            paVar27->mNumWeights = 0;
            paVar27->mWeights = (aiVertexWeight *)0x0;
            (paVar27->mOffsetMatrix).a1 = 1.0;
            (paVar27->mOffsetMatrix).a2 = 0.0;
            (paVar27->mOffsetMatrix).a3 = 0.0;
            (paVar27->mOffsetMatrix).a4 = 0.0;
            (paVar27->mOffsetMatrix).b1 = 0.0;
            (paVar27->mOffsetMatrix).b2 = 1.0;
            (paVar27->mOffsetMatrix).b3 = 0.0;
            (paVar27->mOffsetMatrix).b4 = 0.0;
            (paVar27->mOffsetMatrix).c1 = 0.0;
            (paVar27->mOffsetMatrix).c2 = 0.0;
            (paVar27->mOffsetMatrix).c3 = 1.0;
            (paVar27->mOffsetMatrix).c4 = 0.0;
            (paVar27->mOffsetMatrix).d1 = 0.0;
            (paVar27->mOffsetMatrix).d2 = 0.0;
            (paVar27->mOffsetMatrix).d3 = 0.0;
            (paVar27->mOffsetMatrix).d4 = 1.0;
            lVar36 = *(long *)&((((node->skin).vector)->
                                super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>).
                                _M_impl.super__Vector_impl_data._M_start[(node->skin).index]->
                               jointNames).
                               super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                               ._M_impl;
            plVar15 = *(long **)(lVar36 + uVar21 * 0x10);
            uVar37 = (ulong)*(uint *)(lVar36 + 8 + uVar21 * 0x10);
            lVar36 = *(long *)(*plVar15 + uVar37 * 8);
            uVar39 = *(ulong *)(lVar36 + 0x38);
            if (uVar39 == 0) {
              if ((ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                   ::kDefaultName_abi_cxx11_ == '\0') &&
                 (iVar20 = __cxa_guard_acquire(&ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                                                ::kDefaultName_abi_cxx11_), iVar20 != 0)) {
                ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                ::kDefaultName_abi_cxx11_._M_dataplus._M_p =
                     (pointer)&ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                               ::kDefaultName_abi_cxx11_.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)
                           &ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                            ::kDefaultName_abi_cxx11_,"bone_","");
                __cxa_atexit(std::__cxx11::string::~string,
                             &ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                              ::kDefaultName_abi_cxx11_,&__dso_handle);
                __cxa_guard_release(&ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                                     ::kDefaultName_abi_cxx11_);
              }
              local_a8 = 0;
              _local_b0 = 0;
              uVar35 = 1;
              uVar39 = uVar21 & 0xffffffff;
              pcVar41 = (char *)&local_b0;
              if ((int)uVar21 < 0) {
                _local_b0 = 0x2d;
                uVar39 = (ulong)(uint)-(int)uVar21;
                uVar35 = 2;
                pcVar41 = (char *)((long)&local_b0 + 1);
              }
              iVar20 = 1000000000;
              bVar40 = false;
              do {
                pcVar42 = pcVar41;
                if (9 < uVar35) break;
                lVar36 = (long)(int)uVar39 / (long)iVar20;
                uVar34 = (long)(int)uVar39 % (long)iVar20 & 0xffffffff;
                if (((bVar40) || (iVar20 == 1)) || ((int)lVar36 != 0)) {
                  pcVar42 = pcVar41 + 1;
                  uVar35 = uVar35 + 1;
                  *pcVar41 = (char)lVar36 + '0';
                  bVar40 = true;
                  uVar39 = uVar34;
                  pcVar41 = pcVar42;
                  if (iVar20 != 1) goto LAB_00666500;
                  bVar17 = false;
                  iVar20 = 1;
                }
                else {
LAB_00666500:
                  iVar20 = iVar20 / 10;
                  bVar17 = true;
                  pcVar42 = pcVar41;
                }
                pcVar41 = pcVar42;
              } while (bVar17);
              *pcVar42 = '\0';
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d0,
                         ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                         ::kDefaultName_abi_cxx11_._M_dataplus._M_p,
                         ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                         ::kDefaultName_abi_cxx11_._M_dataplus._M_p +
                         ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                         ::kDefaultName_abi_cxx11_._M_string_length);
              std::__cxx11::string::append((char *)&local_d0);
              sVar18 = local_d0._M_string_length;
              if (local_d0._M_string_length < 0x400) {
                (paVar27->mName).length = (ai_uint32)local_d0._M_string_length;
                memcpy(pcVar33,local_d0._M_dataplus._M_p,local_d0._M_string_length);
                (paVar27->mName).data[sVar18] = '\0';
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p);
              }
            }
            else if (uVar39 < 0x400) {
              (paVar27->mName).length = (ai_uint32)uVar39;
              memcpy(pcVar33,*(void **)(lVar36 + 0x30),uVar39);
              (paVar27->mName).data[uVar39] = '\0';
            }
            GetNodeTransform(&paVar27->mOffsetMatrix,*(Node **)(*plVar15 + uVar37 * 8));
            pvVar19 = local_58.
                      super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            (paVar27->mOffsetMatrix).a1 = local_80[uVar21][0];
            (paVar27->mOffsetMatrix).b1 = local_80[uVar21][1];
            (paVar27->mOffsetMatrix).c1 = local_80[uVar21][2];
            (paVar27->mOffsetMatrix).d1 = local_80[uVar21][3];
            (paVar27->mOffsetMatrix).a2 = local_80[uVar21][4];
            (paVar27->mOffsetMatrix).b2 = local_80[uVar21][5];
            (paVar27->mOffsetMatrix).c2 = local_80[uVar21][6];
            (paVar27->mOffsetMatrix).d2 = local_80[uVar21][7];
            (paVar27->mOffsetMatrix).a3 = local_80[uVar21][8];
            (paVar27->mOffsetMatrix).b3 = local_80[uVar21][9];
            (paVar27->mOffsetMatrix).c3 = local_80[uVar21][10];
            (paVar27->mOffsetMatrix).d3 = local_80[uVar21][0xb];
            (paVar27->mOffsetMatrix).a4 = local_80[uVar21][0xc];
            (paVar27->mOffsetMatrix).b4 = local_80[uVar21][0xd];
            (paVar27->mOffsetMatrix).c4 = local_80[uVar21][0xe];
            (paVar27->mOffsetMatrix).d4 = local_80[uVar21][0xf];
            uVar37 = (long)local_58.
                           super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar21].
                           super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_58.
                           super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar21].
                           super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                           _M_impl.super__Vector_impl_data._M_start;
            uVar39 = (long)uVar37 >> 3;
            uVar35 = (uint)uVar39;
            paVar27->mNumWeights = uVar35;
            if (uVar35 == 0) {
              paVar28 = (aiVertexWeight *)operator_new__(8);
              paVar28->mVertexId = 0;
              paVar28->mWeight = 0.0;
              paVar27->mWeights = paVar28;
              paVar27->mNumWeights = 1;
              paVar28->mVertexId = 0;
              paVar28->mWeight = 0.0;
            }
            else {
              uVar39 = (uVar39 & 0xffffffff) << 3;
              paVar28 = (aiVertexWeight *)operator_new__(uVar39);
              memset(paVar28,0,uVar39);
              paVar27->mWeights = paVar28;
              memcpy(paVar28,pvVar19[uVar21].
                             super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                             _M_impl.super__Vector_impl_data._M_start,uVar37 & 0x7fffffff8);
            }
            local_60->mBones[uVar21] = paVar27;
            uVar21 = uVar21 + 1;
            node = local_88;
          } while (uVar21 < local_60->mNumBones);
        }
        if (local_80 != (float (*) [16])0x0) {
          operator_delete__(local_80);
        }
        std::
        vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
        ::~vector(&local_58);
        uVar21 = local_38 + 1;
      } while (uVar21 != local_40);
    }
    puVar6 = (local_90->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar35 = puVar6[local_70];
    if (uVar35 < puVar6[local_70 + 1]) {
      lVar36 = 0;
      do {
        this->mMeshes[lVar36] = uVar35 + (int)lVar36;
        lVar36 = lVar36 + 1;
      } while ((int)lVar36 + uVar35 <
               (local_90->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[local_70 + 1]);
    }
  }
  if (((node->camera).vector != (vector<glTF2::Camera_*,_std::allocator<glTF2::Camera_*>_> *)0x0) &&
     (paVar23 = (aiNode *)local_98->mCameras[(node->camera).index], paVar23 != this)) {
    uVar35 = (this->mName).length;
    (paVar23->mName).length = uVar35;
    memcpy((paVar23->mName).data,(this->mName).data,(ulong)uVar35);
    (paVar23->mName).data[uVar35] = '\0';
  }
  if ((node->light).vector != (vector<glTF2::Light_*,_std::allocator<glTF2::Light_*>_> *)0x0) {
    paVar23 = (aiNode *)local_98->mLights[(node->light).index];
    if (paVar23 != this) {
      uVar35 = (this->mName).length;
      (paVar23->mName).length = uVar35;
      memcpy((paVar23->mName).data,(this->mName).data,(ulong)uVar35);
      (paVar23->mName).data[uVar35] = '\0';
    }
    if (((((node->light).vector)->
         super__Vector_base<glTF2::Light_*,_std::allocator<glTF2::Light_*>_>)._M_impl.
         super__Vector_impl_data._M_start[(node->light).index]->range).isPresent == true) {
      paVar29 = (aiMetadata *)operator_new(0x18);
      paVar29->mKeys = (aiString *)0x0;
      paVar29->mValues = (aiMetadataEntry *)0x0;
      paVar29->mNumProperties = 1;
      paVar30 = (aiString *)operator_new__(0x404);
      paVar30->length = 0;
      paVar30->data[0] = '\0';
      memset(paVar30->data + 1,0x1b,0x3ff);
      paVar29->mKeys = paVar30;
      uVar21 = (ulong)paVar29->mNumProperties << 4;
      __s = (aiMetadataEntry *)operator_new__(uVar21);
      memset(__s,0,uVar21);
      paVar29->mValues = __s;
      this->mMetaData = paVar29;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"PBR_LightRange","");
      if ((paVar29->mNumProperties != 0) && (local_d0._M_string_length != 0)) {
        pLVar16 = (((node->light).vector)->
                  super__Vector_base<glTF2::Light_*,_std::allocator<glTF2::Light_*>_>)._M_impl.
                  super__Vector_impl_data._M_start[(node->light).index];
        if (local_d0._M_string_length < 0x400) {
          paVar30 = paVar29->mKeys;
          paVar30->length = (ai_uint32)local_d0._M_string_length;
          memcpy(paVar30->data,local_d0._M_dataplus._M_p,local_d0._M_string_length);
          paVar30->data[local_d0._M_string_length] = '\0';
        }
        paVar29->mValues->mType = AI_FLOAT;
        pfVar31 = (float *)operator_new(4);
        *pfVar31 = (pLVar16->range).value;
        paVar29->mValues->mData = pfVar31;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
  }
  return this;
}

Assistant:

aiNode* ImportNode(aiScene* pScene, glTF2::Asset& r, std::vector<unsigned int>& meshOffsets, glTF2::Ref<glTF2::Node>& ptr)
{
    Node& node = *ptr;

    aiNode* ainode = new aiNode(GetNodeName(node));

    if (!node.children.empty()) {
        ainode->mNumChildren = unsigned(node.children.size());
        ainode->mChildren = new aiNode*[ainode->mNumChildren];

        for (unsigned int i = 0; i < ainode->mNumChildren; ++i) {
            aiNode* child = ImportNode(pScene, r, meshOffsets, node.children[i]);
            child->mParent = ainode;
            ainode->mChildren[i] = child;
        }
    }

    GetNodeTransform(ainode->mTransformation, node);

    if (!node.meshes.empty()) {
        // GLTF files contain at most 1 mesh per node.
        assert(node.meshes.size() == 1);
        int mesh_idx = node.meshes[0].GetIndex();
        int count = meshOffsets[mesh_idx + 1] - meshOffsets[mesh_idx];

        ainode->mNumMeshes = count;
        ainode->mMeshes = new unsigned int[count];

        if (node.skin) {
            for (int primitiveNo = 0; primitiveNo < count; ++primitiveNo) {
                aiMesh* mesh = pScene->mMeshes[meshOffsets[mesh_idx]+primitiveNo];
                mesh->mNumBones = static_cast<unsigned int>(node.skin->jointNames.size());
                mesh->mBones = new aiBone*[mesh->mNumBones];

                // GLTF and Assimp choose to store bone weights differently.
                // GLTF has each vertex specify which bones influence the vertex.
                // Assimp has each bone specify which vertices it has influence over.
                // To convert this data, we first read over the vertex data and pull
                // out the bone-to-vertex mapping.  Then, when creating the aiBones,
                // we copy the bone-to-vertex mapping into the bone.  This is unfortunate
                // both because it's somewhat slow and because, for many applications,
                // we then need to reconvert the data back into the vertex-to-bone
                // mapping which makes things doubly-slow.
                std::vector<std::vector<aiVertexWeight>> weighting(mesh->mNumBones);
                BuildVertexWeightMapping(node.meshes[0]->primitives[primitiveNo], weighting);

                mat4* pbindMatrices = nullptr;
                node.skin->inverseBindMatrices->ExtractData(pbindMatrices);

                for (uint32_t i = 0; i < mesh->mNumBones; ++i) {
                    aiBone* bone = new aiBone();

                    Ref<Node> joint = node.skin->jointNames[i];
                    if (!joint->name.empty()) {
                      bone->mName = joint->name;
                    } else {
                      // Assimp expects each bone to have a unique name.
                      static const std::string kDefaultName = "bone_";
                      char postfix[10] = {0};
                      ASSIMP_itoa10(postfix, i);
                      bone->mName = (kDefaultName + postfix);
                    }
                    GetNodeTransform(bone->mOffsetMatrix, *joint);

                    CopyValue(pbindMatrices[i], bone->mOffsetMatrix);

                    std::vector<aiVertexWeight>& weights = weighting[i];

                    bone->mNumWeights = static_cast<uint32_t>(weights.size());
                    if (bone->mNumWeights > 0) {
                      bone->mWeights = new aiVertexWeight[bone->mNumWeights];
                      memcpy(bone->mWeights, weights.data(), bone->mNumWeights * sizeof(aiVertexWeight));
                    } else {
                      // Assimp expects all bones to have at least 1 weight.
                      bone->mWeights = new aiVertexWeight[1];
                      bone->mNumWeights = 1;
                      bone->mWeights->mVertexId = 0;
                      bone->mWeights->mWeight = 0.f;
                    }
                    mesh->mBones[i] = bone;
                }

                if (pbindMatrices) {
                    delete[] pbindMatrices;
                }
            }
        }

        int k = 0;
        for (unsigned int j = meshOffsets[mesh_idx]; j < meshOffsets[mesh_idx + 1]; ++j, ++k) {
            ainode->mMeshes[k] = j;
        }
    }

    if (node.camera) {
        pScene->mCameras[node.camera.GetIndex()]->mName = ainode->mName;
    }

    if (node.light) {
        pScene->mLights[node.light.GetIndex()]->mName = ainode->mName;

        //range is optional - see https://github.com/KhronosGroup/glTF/tree/master/extensions/2.0/Khronos/KHR_lights_punctual
        //it is added to meta data of parent node, because there is no other place to put it
        if (node.light->range.isPresent)
        {
            ainode->mMetaData = aiMetadata::Alloc(1);
            ainode->mMetaData->Set(0, "PBR_LightRange", node.light->range.value);
        }
    }

    return ainode;
}